

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_font.cpp
# Opt level: O2

void __thiscall FSingleLumpFont::CheckFON1Chars(FSingleLumpFont *this,double *luminosity)

{
  byte *pbVar1;
  byte bVar2;
  int height;
  CharData *pCVar3;
  uint uVar4;
  int iVar5;
  FFontChar2 *this_00;
  long lVar6;
  uint uVar7;
  long lVar8;
  FMemLump FVar9;
  byte *pbVar10;
  char *pcVar11;
  int iVar12;
  FMemLump memLump;
  int local_248;
  BYTE used [256];
  byte abStack_138 [264];
  
  FWadCollection::ReadLump((FWadCollection *)&memLump,0x1c6a4b0);
  pcVar11 = (char *)0x0;
  FVar9 = memLump;
  if (*(int *)((long)memLump.Block.Chars + -0xc) == 0) {
    FVar9.Block.Chars = (FString)(FString)pcVar11;
  }
  memset(used,0,0x100);
  pbVar10 = (byte *)((long)FVar9.Block.Chars + 8);
  for (; pcVar11 != (char *)0x100; pcVar11 = pcVar11 + 1) {
    iVar5 = (this->super_FFont).SpaceWidth;
    height = (this->super_FFont).FontHeight;
    iVar12 = height * iVar5;
    if ((this->super_FFont).Chars[(long)pcVar11].Pic == (FTexture *)0x0) {
      this_00 = (FFontChar2 *)operator_new(0x78);
      local_248 = SUB84(FVar9.Block.Chars,0);
      FFontChar2::FFontChar2
                (this_00,(this->super_FFont).Lump,(int)pbVar10 - local_248,iVar5,height,0,0);
      pCVar3 = (this->super_FFont).Chars;
      pCVar3[(long)pcVar11].Pic = (FTexture *)this_00;
      pCVar3[(long)pcVar11].XMove = (this->super_FFont).SpaceWidth;
    }
    do {
      uVar4 = (uint)(char)*pbVar10;
      if ((int)uVar4 < 0) {
        pbVar1 = pbVar10 + 1;
        pbVar10 = pbVar10 + 2;
        used[*pbVar1] = '\x01';
        iVar12 = iVar12 + uVar4 + -1;
      }
      else {
        uVar7 = ~uVar4;
        while( true ) {
          pbVar10 = pbVar10 + 1;
          if ((char)uVar4 < '\0') break;
          uVar4 = (uint)(byte)((char)uVar4 - 1);
          used[*pbVar10] = '\x01';
        }
        iVar12 = iVar12 + uVar7;
      }
    } while (0 < iVar12);
  }
  memset((this->super_FFont).PatchRemap,0,0x100);
  iVar5 = 1;
  for (lVar8 = 1; lVar6 = (long)iVar5, lVar8 != 0x100; lVar8 = lVar8 + 1) {
    if (used[lVar8] != '\0') {
      iVar5 = iVar5 + 1;
      abStack_138[lVar6] = (byte)lVar8;
    }
  }
  for (lVar8 = 1; lVar8 < lVar6; lVar8 = lVar8 + 1) {
    bVar2 = abStack_138[lVar8];
    (this->super_FFont).PatchRemap[bVar2] = (BYTE)lVar8;
    luminosity[lVar8] = (double)(int)(bVar2 - 1) / 254.0;
  }
  (this->super_FFont).ActiveColors = iVar5;
  FMemLump::~FMemLump(&memLump);
  return;
}

Assistant:

void FSingleLumpFont::CheckFON1Chars (double *luminosity)
{
	FMemLump memLump = Wads.ReadLump(Lump);
	const BYTE* data = (const BYTE*) memLump.GetMem();

	BYTE used[256], reverse[256];
	const BYTE *data_p;
	int i, j;

	memset (used, 0, 256);
	data_p = data + 8;

	for (i = 0; i < 256; ++i)
	{
		int destSize = SpaceWidth * FontHeight;

		if(!Chars[i].Pic)
		{
			Chars[i].Pic = new FFontChar2 (Lump, int(data_p - data), SpaceWidth, FontHeight);
			Chars[i].XMove = SpaceWidth;
		}

		// Advance to next char's data and count the used colors.
		do
		{
			SBYTE code = *data_p++;
			if (code >= 0)
			{
				destSize -= code+1;
				while (code-- >= 0)
				{
					used[*data_p++] = 1;
				}
			}
			else if (code != -128)
			{
				used[*data_p++] = 1;
				destSize -= 1 - code;
			}
		} while (destSize > 0);
	}

	memset (PatchRemap, 0, 256);
	reverse[0] = 0;
	for (i = 1, j = 1; i < 256; ++i)
	{
		if (used[i])
		{
			reverse[j++] = i;
		}
	}
	for (i = 1; i < j; ++i)
	{
		PatchRemap[reverse[i]] = i;
		luminosity[i] = (reverse[i] - 1) / 254.0;
	}
	ActiveColors = j;
}